

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_error.c
# Opt level: O3

void l2_internal_error(l2_internal_error_type error_type,...)

{
  undefined8 in_RSI;
  char *__format;
  va_list va;
  
  switch(error_type) {
  case L2_INTERNAL_ERROR_OUT_OF_RANGE:
    __format = anon_var_dwarf_2a0a;
    break;
  case L2_INTERNAL_ERROR_NULL_POINTER:
    __format = anon_var_dwarf_29ec;
    break;
  case L2_INTERNAL_ERROR_ILLEGAL_OPERATION:
    __format = anon_var_dwarf_2a20;
    break;
  case L2_INTERNAL_ERROR_UNREACHABLE_CODE:
    __format = anon_var_dwarf_2a36;
    break;
  case L2_INTERNAL_ERROR_MEM_BLOCK_NOT_MANAGED:
    __format = anon_var_dwarf_2a4c;
    break;
  case L2_INTERNAL_ERROR_MEM_BLOCK_NOT_IN_GC:
    __format = anon_var_dwarf_2a62;
    break;
  default:
    __format = anon_var_dwarf_2a78;
  }
  fprintf(_stderr,__format,in_RSI);
  fwrite(anon_var_dwarf_2a82,0x1c,1,_stderr);
  l2_clean_before_abort();
  exit(error_type);
}

Assistant:

void _Noreturn l2_internal_error(const l2_internal_error_type error_type, ...) {
    va_list va;
    va_start(va, error_type);
    char *msg;
    void *ptr;

    switch (error_type) {
        case L2_INTERNAL_ERROR_NULL_POINTER:
            msg = va_arg(va, char *);
            fprintf(stderr, "L2 解释器内部错误: \n\t使用空指针进行操作: %s\n", msg);
            break;

        case L2_INTERNAL_ERROR_OUT_OF_RANGE:
            msg = va_arg(va, char *);
            fprintf(stderr, "L2 解释器内部错误: \n\t超出数据范围: %s\n", msg);
            break;

        case L2_INTERNAL_ERROR_ILLEGAL_OPERATION:
            msg = va_arg(va, char *);
            fprintf(stderr, "L2 解释器内部错误: \n\t检测到非法操作: %s\n", msg);
            break;

        case L2_INTERNAL_ERROR_UNREACHABLE_CODE:
            msg = va_arg(va, char *);
            fprintf(stderr, "L2 解释器内部错误: \n\t运行至无法到达的代码段: %s\n", msg);
            break;

        case L2_INTERNAL_ERROR_MEM_BLOCK_NOT_MANAGED:
            ptr = va_arg(va, void *);
            fprintf(stderr, "L2 解释器内部错误: \n\t内存区块未托管: 指针 - %p\n", ptr);
            break;

        case L2_INTERNAL_ERROR_MEM_BLOCK_NOT_IN_GC:
            ptr = va_arg(va, void *);
            fprintf(stderr, "L2 解释器内部错误: \n\t内存区块未在 GC(垃圾回收) 链中: 指针 - %p\n", ptr);
            break;

        default:
            msg = va_arg(va, char *);
            fprintf(stderr, "L2 解释器内部错误: \n\t发生未知错误: %s\n", msg);
    }

    fprintf(stderr, "L2 解释器已异常终止\n");

    va_end(va);
    l2_clean_before_abort();
    exit(error_type);
}